

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_tracker.cpp
# Opt level: O1

void __thiscall libtorrent::dht::dht_tracker::add_router_node(dht_tracker *this,endpoint *node)

{
  _Rb_tree_node_base *p_Var1;
  
  for (p_Var1 = (this->m_nodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->m_nodes)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var1)) {
    dht::node::add_router_node((node *)&p_Var1[1]._M_left,node);
  }
  return;
}

Assistant:

void dht_tracker::add_router_node(udp::endpoint const& node)
	{
		for (auto& n : m_nodes)
			n.second.dht.add_router_node(node);
	}